

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O3

CURLcode Curl_dyn_add(dynbuf *s,char *str)

{
  CURLcode CVar1;
  size_t len;
  
  len = strlen(str);
  CVar1 = dyn_nappend(s,(uchar *)str,len);
  return CVar1;
}

Assistant:

CURLcode Curl_dyn_add(struct dynbuf *s, const char *str)
{
  size_t n;
  DEBUGASSERT(str);
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  n = strlen(str);
  return dyn_nappend(s, (unsigned char *)str, n);
}